

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O3

void __thiscall
ParsedLPCMTrackData::ParsedLPCMTrackData(ParsedLPCMTrackData *this,MatroskaTrack *track)

{
  ushort channels;
  uint16_t bitdepth;
  pointer puVar1;
  uchar *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  pointer puVar7;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  (this->super_ParsedTrackPrivData)._vptr_ParsedTrackPrivData =
       (_func_int **)&PTR__ParsedLPCMTrackData_0023e010;
  (this->m_waveBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_waveBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_waveBuffer).m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_waveBuffer).m_size = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,track->codec_id,&local_61);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"/BIG","");
  bVar6 = strEndWith(&local_40,&local_60);
  this->m_convertBytes = bVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  channels = *(ushort *)&track->field_0x84;
  this->m_channels = channels;
  bitdepth = *(uint16_t *)&track->field_0x86;
  this->m_bitdepth = bitdepth;
  wave_format::buildWaveHeader
            (&this->m_waveBuffer,*(int *)&track[1].field_0x4,channels,5 < channels,bitdepth);
  if (track->codec_priv_size == 0x28) {
    puVar1 = (this->m_waveBuffer).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (pointer)0x0;
    if (puVar1 != (this->m_waveBuffer).m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      puVar7 = puVar1;
    }
    puVar2 = track->codec_priv;
    *(undefined8 *)(puVar7 + 0x34) = *(undefined8 *)(puVar2 + 0x20);
    uVar3 = *(undefined8 *)puVar2;
    uVar4 = *(undefined8 *)(puVar2 + 8);
    uVar5 = *(undefined8 *)(puVar2 + 0x18);
    *(undefined8 *)(puVar7 + 0x24) = *(undefined8 *)(puVar2 + 0x10);
    *(undefined8 *)(puVar7 + 0x2c) = uVar5;
    *(undefined8 *)(puVar7 + 0x14) = uVar3;
    *(undefined8 *)(puVar7 + 0x1c) = uVar4;
  }
  return;
}

Assistant:

ParsedLPCMTrackData::ParsedLPCMTrackData(MatroskaTrack* track)
    : ParsedTrackPrivData(track->codec_priv, track->codec_priv_size)
{
    m_convertBytes = strEndWith(track->codec_id, "/BIG");
    const auto audiotrack = reinterpret_cast<MatroskaAudioTrack*>(track);
    m_channels = audiotrack->channels;
    m_bitdepth = audiotrack->bitdepth;

    buildWaveHeader(m_waveBuffer, audiotrack->samplerate, m_channels, m_channels >= 6, m_bitdepth);

    if (track->codec_priv_size == sizeof(WAVEFORMATPCMEX))
        memcpy(m_waveBuffer.data() + 20, track->codec_priv, track->codec_priv_size);
}